

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestEagerMaybeLazy::ByteSizeLong(TestEagerMaybeLazy *this)

{
  anon_union_32_1_493b367e_for_TestEagerMaybeLazy_3 aVar1;
  size_t sVar2;
  size_t sVar3;
  
  aVar1 = this->field_0;
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x7) == (undefined1  [32])0x0) {
    sVar3 = 0;
  }
  else {
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<proto2_unittest::TestAllTypes>
                        ((this->field_0)._impl_.message_foo_);
      sVar3 = sVar3 + 1;
    }
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      sVar2 = google::protobuf::internal::WireFormatLite::MessageSize<proto2_unittest::TestAllTypes>
                        ((this->field_0)._impl_.message_bar_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if (((undefined1  [32])aVar1 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestEagerMaybeLazy_NestedMessage>
                        ((this->field_0)._impl_.message_baz_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestEagerMaybeLazy::ByteSizeLong() const {
  const TestEagerMaybeLazy& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestEagerMaybeLazy)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .proto2_unittest.TestAllTypes message_foo = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_foo_);
    }
    // .proto2_unittest.TestAllTypes message_bar = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_bar_);
    }
    // .proto2_unittest.TestEagerMaybeLazy.NestedMessage message_baz = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_baz_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}